

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_named_interface_blocks.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_61728::flatten_named_interface_blocks_declarations::handle_rvalue
          (flatten_named_interface_blocks_declarations *this,ir_rvalue **rvalue)

{
  ir_rvalue *piVar1;
  ir_dereference_array *deref_array_prev;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar5;
  hash_entry *phVar6;
  ir_dereference_variable *this_00;
  ir_variable *piVar4;
  
  piVar1 = *rvalue;
  if ((piVar1 != (ir_rvalue *)0x0) &&
     ((piVar1->super_ir_instruction).ir_type == ir_type_dereference_record)) {
    iVar3 = (*(piVar1->super_ir_instruction)._vptr_ir_instruction[8])(piVar1);
    piVar4 = (ir_variable *)CONCAT44(extraout_var,iVar3);
    if (piVar4 != (ir_variable *)0x0) {
      bVar2 = ir_variable::is_interface_instance(piVar4);
      if (((bVar2) && (1 < (*(uint *)&piVar4->data >> 0xc & 0xf) - 1)) &&
         (piVar4->interface_type != (glsl_type *)0x0)) {
        pcVar5 = " out";
        if ((*(uint *)&piVar4->data & 0xf000) == 0x4000) {
          pcVar5 = " in";
        }
        pcVar5 = ralloc_asprintf(this->mem_ctx,"%s %s.%s.%s",pcVar5 + 1,piVar4->interface_type->name
                                 ,piVar4->name,
                                 *(undefined8 *)
                                  (*(long *)(piVar1[1].super_ir_instruction._vptr_ir_instruction[4]
                                            + 0x20) + 8 +
                                  (long)*(int *)&piVar1[1].super_ir_instruction.super_exec_node.next
                                  * 0x30));
        phVar6 = _mesa_hash_table_search(this->interface_namespace,pcVar5);
        if (phVar6 == (hash_entry *)0x0) {
          __assert_fail("entry",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_named_interface_blocks.cpp"
                        ,0x127,
                        "virtual void (anonymous namespace)::flatten_named_interface_blocks_declarations::handle_rvalue(ir_rvalue **)"
                       );
        }
        piVar4 = (ir_variable *)phVar6->data;
        this_00 = (ir_dereference_variable *)exec_node::operator_new(0x30,this->mem_ctx);
        ir_dereference_variable::ir_dereference_variable(this_00,piVar4);
        deref_array_prev =
             (ir_dereference_array *)piVar1[1].super_ir_instruction._vptr_ir_instruction;
        if ((deref_array_prev != (ir_dereference_array *)0x0) &&
           ((deref_array_prev->super_ir_dereference).super_ir_rvalue.super_ir_instruction.ir_type ==
            ir_type_dereference_array)) {
          this_00 = (ir_dereference_variable *)
                    process_array_ir(this->mem_ctx,deref_array_prev,(ir_rvalue *)this_00);
        }
        *rvalue = (ir_rvalue *)this_00;
      }
    }
  }
  return;
}

Assistant:

void
flatten_named_interface_blocks_declarations::handle_rvalue(ir_rvalue **rvalue)
{
   if (*rvalue == NULL)
      return;

   ir_dereference_record *ir = (*rvalue)->as_dereference_record();
   if (ir == NULL)
      return;

   ir_variable *var = ir->variable_referenced();
   if (var == NULL)
      return;

   if (!var->is_interface_instance())
      return;

   /* It should be possible to handle uniforms during this pass,
    * but, this will require changes to the other uniform block
    * support code.
    */
   if (var->data.mode == ir_var_uniform || var->data.mode == ir_var_shader_storage)
      return;

   if (var->get_interface_type() != NULL) {
      char *iface_field_name =
         ralloc_asprintf(mem_ctx, "%s %s.%s.%s",
                         var->data.mode == ir_var_shader_in ? "in" : "out",
                         var->get_interface_type()->name,
                         var->name,
                         ir->record->type->fields.structure[ir->field_idx].name);

      /* Find the variable in the set of flattened interface blocks */
      hash_entry *entry = _mesa_hash_table_search(interface_namespace,
                                                  iface_field_name);
      assert(entry);
      ir_variable *found_var = (ir_variable *) entry->data;

      ir_dereference_variable *deref_var =
         new(mem_ctx) ir_dereference_variable(found_var);

      ir_dereference_array *deref_array =
         ir->record->as_dereference_array();
      if (deref_array != NULL) {
         *rvalue = process_array_ir(mem_ctx, deref_array,
                                    (ir_rvalue *)deref_var);
      } else {
         *rvalue = deref_var;
      }
   }
}